

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

int Extra_bddCheckUnateNaive(DdManager *dd,DdNode *bF,int iVar)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  
  if (iVar < dd->size) {
    pDVar3 = Cudd_bddIthVar(dd,iVar);
    pDVar3 = Cudd_Cofactor(dd,bF,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar3);
    pDVar4 = Cudd_bddIthVar(dd,iVar);
    pDVar4 = Cudd_Cofactor(dd,bF,pDVar4);
    Cudd_Ref(pDVar4);
    iVar1 = Cudd_bddLeq(dd,pDVar3,pDVar4);
    iVar2 = 1;
    if (iVar1 == 0) {
      iVar2 = Cudd_bddLeq(dd,pDVar4,pDVar3);
      iVar2 = -(uint)(iVar2 != 0);
    }
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,pDVar4);
    return iVar2;
  }
  __assert_fail("iVar < dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddUnate.c"
                ,0x15a,"int Extra_bddCheckUnateNaive(DdManager *, DdNode *, int)");
}

Assistant:

int Extra_bddCheckUnateNaive( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int iVar) 
{
    DdNode * bCof0, * bCof1;
    int Res;

    assert( iVar < dd->size );

    bCof0 = Cudd_Cofactor( dd, bF, Cudd_Not(Cudd_bddIthVar(dd,iVar)) );  Cudd_Ref( bCof0 );
    bCof1 = Cudd_Cofactor( dd, bF, Cudd_bddIthVar(dd,iVar) );            Cudd_Ref( bCof1 );

    if ( Cudd_bddLeq( dd, bCof0, bCof1 ) )
        Res = 1;
    else if ( Cudd_bddLeq( dd, bCof1, bCof0 ) )
        Res =-1;
    else
        Res = 0;

    Cudd_RecursiveDeref( dd, bCof0 );
    Cudd_RecursiveDeref( dd, bCof1 );
    return Res;
}